

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.c
# Opt level: O0

float add(float value)

{
  float local_10;
  float local_c;
  float scanValue;
  float value_local;
  
  local_10 = 0.0;
  local_c = value;
  printf("%.2f + ",(double)value);
  __isoc99_scanf("%f",&local_10);
  return local_c + local_10;
}

Assistant:

float add(float value) {
    float scanValue = 0;
    printf("%.2f + ", value);
    /* Asks for the value to add */
    scanf("%f", &scanValue);
    /* Adds the value and returns it. */
    return value + scanValue;
}